

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O0

bool VulkanUtilities::anon_unknown_1::IsExtensionAvailable
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions,
               char *ExtensionName)

{
  bool bVar1;
  int iVar2;
  Char *Message;
  reference __s1;
  char (*in_RCX) [25];
  VkExtensionProperties *Extension;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range2;
  undefined1 local_40 [8];
  string msg;
  char *ExtensionName_local;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions_local;
  
  msg.field_2._8_8_ = ExtensionName;
  if (ExtensionName == (char *)0x0) {
    Diligent::FormatString<char[26],char[25]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ExtensionName != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"IsExtensionAvailable",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x91);
    std::__cxx11::string::~string((string *)local_40);
  }
  __end2 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                     (Extensions);
  Extension = (VkExtensionProperties *)
              std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                        (Extensions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                *)&Extension);
    if (!bVar1) {
      return false;
    }
    __s1 = __gnu_cxx::
           __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
           ::operator*(&__end2);
    iVar2 = strcmp(__s1->extensionName,(char *)msg.field_2._8_8_);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool IsExtensionAvailable(const std::vector<VkExtensionProperties>& Extensions, const char* ExtensionName)
{
    VERIFY_EXPR(ExtensionName != nullptr);

    for (const auto& Extension : Extensions)
    {
        if (strcmp(Extension.extensionName, ExtensionName) == 0)
            return true;
    }

    return false;
}